

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSolve.c
# Opt level: O2

DdNode * cuddVerifySol(DdManager *bdd,DdNode *F,DdNode **G,int *yIndex,int n)

{
  int *piVar1;
  DdNode *pDVar2;
  ulong uVar3;
  
  piVar1 = (int *)(((ulong)F & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  uVar3 = (ulong)(uint)n;
  while( true ) {
    if ((int)uVar3 < 1) {
      piVar1 = (int *)(((ulong)F & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return F;
    }
    pDVar2 = Cudd_bddCompose(bdd,F,G[uVar3 - 1],yIndex[uVar3 - 1]);
    if (pDVar2 == (DdNode *)0x0) break;
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(bdd,F);
    uVar3 = uVar3 - 1;
    F = pDVar2;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddVerifySol(
  DdManager * bdd,
  DdNode * F /* the left-hand side of the equation */,
  DdNode ** G /* the array of solutions */,
  int * yIndex /* array holding the y variable indices */,
  int  n /* number of unknowns */)
{
    DdNode *w, *R;

    int j;

    R = F;
    cuddRef(R);
    for(j = n - 1; j >= 0; j--) {
         w = Cudd_bddCompose(bdd, R, G[j], yIndex[j]);
        if (w) {
            cuddRef(w);
        } else {
            return(NULL); 
        }
        Cudd_RecursiveDeref(bdd,R);
        R = w;
    }

    cuddDeref(R);

    return(R);

}